

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

int __thiscall
highs::CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
          (CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,char *__from,char *__to)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  
  if ((char *)*this->first_ == __to) {
    if (__to != (char *)0xffffffffffffffff) {
      lVar3 = this[1].super_RbTree<HighsNodeQueue::SuboptimalNodeRbTree>.rootNode[1];
      dVar1 = *(double *)(lVar3 + 0x48 + (long)__from * 0x90);
      dVar2 = *(double *)(lVar3 + 0x48 + (long)__to * 0x90);
      if ((dVar2 <= dVar1) && (((long)__to <= (long)__from || (dVar2 < dVar1))))
      goto code_r0x001efbf0;
    }
    *this->first_ = (LinkType)__from;
    iVar4 = RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
                      (&this->super_RbTree<HighsNodeQueue::SuboptimalNodeRbTree>,__from,__to);
    return iVar4;
  }
code_r0x001efbf0:
  iVar4 = RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
                    (&this->super_RbTree<HighsNodeQueue::SuboptimalNodeRbTree>,__from,__to);
  return iVar4;
}

Assistant:

void link(LinkType z, LinkType parent) {
    if (first_ == parent) {
      if (parent == RbTreeLinks<LinkType>::noLink() ||
          static_cast<const Impl*>(this)->getKey(z) <
              static_cast<const Impl*>(this)->getKey(parent))
        first_ = z;
    }

    RbTree<Impl>::link(z, parent);
  }